

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O2

void Llb_ManGroupCreate_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Ptr_t *vSupp)

{
  int iVar1;
  
  while( true ) {
    if (pObj->TravId == pAig->nTravIds) {
      return;
    }
    pObj->TravId = pAig->nTravIds;
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 != 0) {
      return;
    }
    if ((*(ulong *)&pObj->field_0x18 & 0x10) != 0) {
      Vec_PtrPush(vSupp,pObj);
      return;
    }
    if (((uint)*(ulong *)&pObj->field_0x18 & 7) != 5) break;
    Llb_ManGroupCreate_rec(pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vSupp);
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  }
  __assert_fail("Aig_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Group.c"
                ,0x9f,"void Llb_ManGroupCreate_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Llb_ManGroupCreate_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Ptr_t * vSupp )
{ 
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( pObj->fMarkA )
    {
        Vec_PtrPush( vSupp, pObj );
        return;
    }
    assert( Aig_ObjIsAnd(pObj) );
    Llb_ManGroupCreate_rec( pAig, Aig_ObjFanin0(pObj), vSupp );
    Llb_ManGroupCreate_rec( pAig, Aig_ObjFanin1(pObj), vSupp );
}